

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

String * __thiscall
kj::_::NullableValue<kj::String>::emplace<kj::String>
          (NullableValue<kj::String> *this,String *params)

{
  String *params_00;
  String *params_local;
  NullableValue<kj::String> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::String>(&(this->field_1).value);
  }
  params_00 = fwd<kj::String>(params);
  ctor<kj::String,kj::String>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (String *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }